

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::OnFlushTimeout
          (TracingServiceImpl *this,TracingSessionID tsid,FlushRequestID flush_request_id)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  const_iterator __position;
  type callback;
  _Any_data local_68;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  undefined8 uStack_40;
  _Base_ptr local_38;
  _Base_ptr p_Stack_30;
  
  if ((tsid != 0) &&
     (p_Var6 = (this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var6 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var6 + 1) >= tsid) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < tsid];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= tsid)) &&
       (p_Var7 = (_Base_ptr)p_Var5[0x10]._M_right, p_Var7 != (_Base_ptr)0x0)) {
      __position._M_node = (_Base_ptr)&p_Var5[0x10]._M_left;
      do {
        if (*(ulong *)(p_Var7 + 1) >= flush_request_id) {
          __position._M_node = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < flush_request_id];
      } while (p_Var7 != (_Base_ptr)0x0);
      if ((__position._M_node != (_Base_ptr)&p_Var5[0x10]._M_left) &&
         (*(ulong *)(__position._M_node + 1) <= flush_request_id)) {
        p_Var2 = __position._M_node[2]._M_left;
        local_48 = (_Base_ptr)0x0;
        uStack_40 = 0;
        local_38 = (_Base_ptr)0x0;
        p_Var3 = __position._M_node[3]._M_left;
        p_Var4 = __position._M_node[3]._M_parent;
        if (p_Var4 != (_Base_ptr)0x0) {
          local_48 = __position._M_node[2]._M_right;
          uStack_40 = *(undefined8 *)(__position._M_node + 3);
          __position._M_node[3]._M_parent = (_Base_ptr)0x0;
          __position._M_node[3]._M_left = (_Base_ptr)0x0;
          local_38 = p_Var4;
        }
        p_Stack_30 = p_Var3;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>,_std::_Select1st<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>_>_>
        ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>,_std::_Select1st<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>_>_>
                        *)&p_Var5[0x10]._M_parent,__position);
        local_68._M_unused._M_object = (_Base_ptr)0x0;
        local_68._8_8_ = 0;
        local_58 = (_Base_ptr)0x0;
        if (p_Var4 != (_Base_ptr)0x0) {
          local_68._M_unused._M_object = local_48;
          local_68._8_8_ = uStack_40;
          local_38 = (_Base_ptr)0x0;
          p_Stack_30 = (_Base_ptr)0x0;
          local_58 = p_Var4;
        }
        local_50 = p_Var3;
        CompleteFlush(this,tsid,(FlushCallback *)&local_68,p_Var2 == (_Base_ptr)0x0);
        if (local_58 != (_Base_ptr)0x0) {
          (*(code *)local_58)(&local_68,&local_68,3);
          if (local_38 != (_Base_ptr)0x0) {
            (*(code *)local_38)(&local_48,&local_48,3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TracingServiceImpl::TracingSession* TracingServiceImpl::GetTracingSession(
    TracingSessionID tsid) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto it = tsid ? tracing_sessions_.find(tsid) : tracing_sessions_.end();
  if (it == tracing_sessions_.end())
    return nullptr;
  return &it->second;
}